

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this,Preset *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined3 uVar6;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_0095d728;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (param_1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Name,pcVar1,pcVar1 + (param_1->Name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Inherits,&param_1->Inherits);
  uVar6 = *(undefined3 *)&param_1->field_0x41;
  uVar3 = *(undefined4 *)&param_1->field_0x44;
  uVar4 = *(undefined4 *)&param_1->OriginFile;
  uVar5 = *(undefined4 *)((long)&param_1->OriginFile + 4);
  this->Hidden = param_1->Hidden;
  *(undefined3 *)&this->field_0x41 = uVar6;
  *(undefined4 *)&this->field_0x44 = uVar3;
  *(undefined4 *)&this->OriginFile = uVar4;
  *(undefined4 *)((long)&this->OriginFile + 4) = uVar5;
  (this->DisplayName)._M_dataplus._M_p = (pointer)&(this->DisplayName).field_2;
  pcVar1 = (param_1->DisplayName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->DisplayName,pcVar1,pcVar1 + (param_1->DisplayName)._M_string_length);
  (this->Description)._M_dataplus._M_p = (pointer)&(this->Description).field_2;
  pcVar1 = (param_1->Description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Description,pcVar1,pcVar1 + (param_1->Description)._M_string_length);
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->ConditionEvaluator).
       super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->ConditionEvaluator).
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->ConditionResult = param_1->ConditionResult;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Rb_tree(&(this->Environment)._M_t,&(param_1->Environment)._M_t);
  return;
}

Assistant:

Preset(const Preset& /*other*/) = default;